

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void sysbvm_functionActivationEnvironment_setBindingActivationValue
               (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding,
               sysbvm_tuple_t value,sysbvm_tuple_t sourcePosition)

{
  sysbvm_size_t index;
  sysbvm_tuple_t sVar1;
  sysbvm_size_t sVar2;
  sysbvm_tuple_t bindingType;
  size_t vectorIndex;
  sysbvm_symbolAnalysisBinding_t *analysisBinding;
  sysbvm_functionActivationEnvironment_t *activationEnvironment;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t binding_local;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  if ((*(long *)(binding + 0x38) != *(long *)(environment + 0x80)) &&
     (*(long *)(environment + 0x88) == 0)) {
LAB_0012a6ea:
    abort();
  }
  index = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(binding + 0x40));
  sVar1 = sysbvm_tuple_getType(context,binding);
  if (sVar1 == (context->roots).symbolLocalBindingType) {
    sVar1 = *(sysbvm_tuple_t *)(environment + 0xa0);
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(environment + 0x90));
    sysbvm_array_atPut(sVar1,sVar2 + index,value);
  }
  else {
    if (sVar1 != (context->roots).symbolArgumentBindingType) goto LAB_0012a6ea;
    sysbvm_array_atPut(*(sysbvm_tuple_t *)(environment + 0xa0),index,value);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionActivationEnvironment_setBindingActivationValue(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding, sysbvm_tuple_t value, sysbvm_tuple_t sourcePosition)
{
    (void)sourcePosition;
    sysbvm_functionActivationEnvironment_t *activationEnvironment = (sysbvm_functionActivationEnvironment_t*)environment;
    sysbvm_symbolAnalysisBinding_t *analysisBinding = (sysbvm_symbolAnalysisBinding_t*)binding;
    if(analysisBinding->ownerFunction == activationEnvironment->functionDefinition || activationEnvironment->dependentFunctionType)
    {
        size_t vectorIndex = sysbvm_tuple_size_decode(analysisBinding->vectorIndex);
        sysbvm_tuple_t bindingType = sysbvm_tuple_getType(context, binding);
        if(bindingType == context->roots.symbolLocalBindingType)
        {
            sysbvm_array_atPut(activationEnvironment->valueVector, sysbvm_tuple_size_decode(activationEnvironment->argumentVectorSize) + vectorIndex, value);
            return;
        }
        else if(bindingType == context->roots.symbolArgumentBindingType)
        {
            sysbvm_array_atPut(activationEnvironment->valueVector, vectorIndex, value);
            return;
        }
    }
    abort();
}